

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Builder * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl::getResultsBuilder
          (Builder *__return_storage_ptr__,RpcServerResponseImpl *this)

{
  Builder builder;
  Builder local_28;
  RpcServerResponseImpl *local_10;
  RpcServerResponseImpl *this_local;
  
  local_10 = this;
  rpc::Payload::Builder::getContent(&local_28,&this->payload);
  builder.builder.capTable = local_28.builder.capTable;
  builder.builder.segment = local_28.builder.segment;
  builder.builder.pointer = local_28.builder.pointer;
  BuilderCapabilityTable::imbue<capnp::AnyPointer::Builder>
            (__return_storage_ptr__,&this->capTable,builder);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder getResultsBuilder() override {
      return capTable.imbue(payload.getContent());
    }